

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

double alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
       compute_expected_cost
                 (V *values,int num_keys,double density,double expected_insert_frac,
                 LinearModel<int> *existing_model,bool use_sampling,DataNodeStats *stats)

{
  int data_capacity;
  long lVar1;
  undefined7 in_register_00000009;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  ExpectedSearchIterationsAccumulator acc;
  LinearModel<int> local_68;
  double local_58;
  StatAccumulator local_50;
  double local_48;
  int local_40;
  int local_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  int iStack_30;
  int local_2c;
  
  if ((int)CONCAT71(in_register_00000009,use_sampling) != 0) {
    dVar3 = compute_expected_cost_sampling
                      (values,num_keys,density,expected_insert_frac,existing_model,stats);
    return dVar3;
  }
  if (num_keys == 0) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = (double)num_keys;
    local_68.a_ = 0.0;
    local_68.b_ = 0.0;
    data_capacity = (int)(dVar3 / density);
    if ((int)(dVar3 / density) < num_keys + 1) {
      data_capacity = num_keys + 1;
    }
    if (existing_model == (LinearModel<int> *)0x0) {
      existing_model = &local_68;
      local_58 = dVar3;
      build_model(values,num_keys,existing_model,false);
      dVar3 = local_58;
    }
    local_68.a_ = ((double)data_capacity / dVar3) * existing_model->a_;
    local_68.b_ = ((double)data_capacity / dVar3) * existing_model->b_;
    if ((expected_insert_frac != 0.0) || (NAN(expected_insert_frac))) {
      local_50._vptr_StatAccumulator = (_func_int **)&PTR__StatAccumulator_00116d78;
      local_48 = 0.0;
      local_40 = -1;
      local_3c = 0;
      uStack_38 = 0;
      uStack_34 = 0;
      iStack_30 = 0;
      local_2c = data_capacity;
      build_node_implicit(values,num_keys,data_capacity,&local_50,&local_68);
      dVar3 = 0.0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (ulong)(iStack_30 != 0) * (long)(local_48 / (double)iStack_30);
      if (iStack_30 != 0) {
        lVar1 = (long)((local_40 - local_3c) + 1);
        dVar3 = (double)(long)(((ulong)(lVar1 * lVar1) >> 2) + CONCAT44(uStack_34,uStack_38)) /
                (double)iStack_30;
      }
    }
    else {
      local_50._vptr_StatAccumulator = (_func_int **)&PTR__StatAccumulator_00116d18;
      local_48 = 0.0;
      local_40 = 0;
      build_node_implicit(values,num_keys,data_capacity,&local_50,&local_68);
      dVar3 = 0.0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (ulong)(local_40 != 0) * (long)(local_48 / (double)local_40);
    }
    if (stats != (DataNodeStats *)0x0) {
      stats->num_search_iterations = auVar2._0_8_;
      stats->num_shifts = dVar3;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar3 * 0.5 * expected_insert_frac;
    auVar2 = vfmadd231sd_fma(auVar4,auVar2,ZEXT816(0x4034000000000000));
    dVar3 = auVar2._0_8_;
  }
  return dVar3;
}

Assistant:

static double compute_expected_cost(
      const V* values, int num_keys, double density,
      double expected_insert_frac,
      const LinearModel<T>* existing_model = nullptr, bool use_sampling = false,
      DataNodeStats* stats = nullptr) {
    if (use_sampling) {
      return compute_expected_cost_sampling(values, num_keys, density,
                                            expected_insert_frac,
                                            existing_model, stats);
    }

    if (num_keys == 0) {
      return 0;
    }

    int data_capacity =
        std::max(static_cast<int>(num_keys / density), num_keys + 1);

    // Compute what the node's model would be
    LinearModel<T> model;
    if (existing_model == nullptr) {
      build_model(values, num_keys, &model);
    } else {
      model.a_ = existing_model->a_;
      model.b_ = existing_model->b_;
    }
    model.expand(static_cast<double>(data_capacity) / num_keys);

    // Compute expected stats in order to compute the expected cost
    double cost = 0;
    double expected_avg_exp_search_iterations = 0;
    double expected_avg_shifts = 0;
    if (expected_insert_frac == 0) {
      ExpectedSearchIterationsAccumulator acc;
      build_node_implicit(values, num_keys, data_capacity, &acc, &model);
      expected_avg_exp_search_iterations = acc.get_stat();
    } else {
      ExpectedIterationsAndShiftsAccumulator acc(data_capacity);
      build_node_implicit(values, num_keys, data_capacity, &acc, &model);
      expected_avg_exp_search_iterations =
          acc.get_expected_num_search_iterations();
      expected_avg_shifts = acc.get_expected_num_shifts();
    }
    cost = kExpSearchIterationsWeight * expected_avg_exp_search_iterations +
           kShiftsWeight * expected_avg_shifts * expected_insert_frac;

    if (stats) {
      stats->num_search_iterations = expected_avg_exp_search_iterations;
      stats->num_shifts = expected_avg_shifts;
    }

    return cost;
  }